

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

void DumpString(TString *s,DumpState *D)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  ulong *puVar4;
  TString *pTVar5;
  lua_State *plVar6;
  lu_byte x_2;
  lu_byte x;
  lu_byte x_1;
  size_t size;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  ulong local_18;
  
  if (s == (TString *)0x0) {
    local_1b = 0;
    if (D->status != 0) {
      return;
    }
    plVar6 = D->L;
    pvVar2 = D->data;
    pTVar5 = (TString *)&local_1b;
    sVar3 = 1;
    goto LAB_00109d55;
  }
  if (s->tt == '\x04') {
    local_18 = (ulong)s->shrlen;
  }
  else {
    local_18 = (s->u).lnglen;
  }
  local_18 = local_18 + 1;
  if (local_18 < 0xff) {
    local_1a = (undefined1)local_18;
    if (D->status == 0) {
      plVar6 = D->L;
      pvVar2 = D->data;
      puVar4 = (ulong *)&local_1a;
      sVar3 = 1;
LAB_00109d31:
      iVar1 = (*D->writer)(plVar6,puVar4,sVar3,pvVar2);
      D->status = iVar1;
    }
  }
  else {
    local_19 = 0xff;
    if (D->status == 0) {
      iVar1 = (*D->writer)(D->L,&local_19,1,D->data);
      D->status = iVar1;
    }
    if (D->status == 0) {
      plVar6 = D->L;
      pvVar2 = D->data;
      puVar4 = &local_18;
      sVar3 = 8;
      goto LAB_00109d31;
    }
  }
  sVar3 = local_18 - 1;
  if (sVar3 == 0) {
    return;
  }
  if (D->status != 0) {
    return;
  }
  pTVar5 = s + 1;
  plVar6 = D->L;
  pvVar2 = D->data;
LAB_00109d55:
  iVar1 = (*D->writer)(plVar6,pTVar5,sVar3,pvVar2);
  D->status = iVar1;
  return;
}

Assistant:

static void DumpString (const TString *s, DumpState *D) {
  if (s == NULL)
    DumpByte(0, D);
  else {
    size_t size = tsslen(s) + 1;  /* include trailing '\0' */
    const char *str = getstr(s);
    if (size < 0xFF)
      DumpByte(cast_int(size), D);
    else {
      DumpByte(0xFF, D);
      DumpVar(size, D);
    }
    DumpVector(str, size - 1, D);  /* no need to save '\0' */
  }
}